

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_indexed(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  _Bool _Var7;
  uint uVar8;
  TCGv_ptr ptr;
  TCGv_i64 pTVar9;
  TCGv_i64 pTVar10;
  TCGv_i64 pTVar11;
  TCGv_i64 tcg_dest;
  TCGv_i32 retval;
  TCGv_i32 pTVar12;
  TCGv_i32 pTVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint srcidx;
  int iVar18;
  uintptr_t o_7;
  ARMISARegisters *pAVar19;
  TCGTemp *ts;
  code *fn;
  uint uVar20;
  uintptr_t o_3;
  long lVar21;
  uint uVar22;
  uint uVar23;
  MemOp MVar24;
  uintptr_t o;
  uint element;
  uintptr_t o_1;
  _Bool _Var25;
  MemOp local_b0;
  code *local_a0;
  TCGv_i64 tcg_res [2];
  
  uVar17 = insn & 0x20000000;
  uVar20 = insn >> 0xc & 0xf;
  uVar22 = uVar17 >> 0x19;
  uVar23 = uVar22 | uVar20;
  if (0x1f < uVar23) goto switchD_00636cd3_caseD_f;
  tcg_ctx = s->uc->tcg_ctx;
  uVar16 = insn >> 0x16 & 3;
  uVar14 = insn >> 0x15 & 1;
  uVar8 = insn >> 0x14 & 1;
  srcidx = insn >> 0x10 & 0xf;
  element = insn >> 0xb & 1;
  bVar1 = (byte)(insn >> 0x18);
  switch(uVar23) {
  case 0:
  case 4:
  case 0x18:
  case 0x1c:
    if ((uVar16 != 2 || (insn & 0x10000000) != 0) ||
       ((s->isar->id_aa64isar0 & 0xf000000000000) == 0)) goto switchD_00636cd3_caseD_f;
    bVar3 = true;
    bVar2 = false;
    _Var25 = false;
    goto LAB_00636e33;
  case 1:
  case 5:
  case 9:
  case 0x19:
    if (uVar16 - 2 < 2) {
      _Var25 = false;
    }
    else {
      if (uVar16 == 1) goto switchD_00636cd3_caseD_f;
      uVar16 = 1;
      pAVar19 = s->isar;
LAB_00636df8:
      if ((pAVar19->id_aa64pfr0 & 0xf0000) != 0x10000) goto switchD_00636cd3_caseD_f;
      _Var25 = true;
    }
    bVar3 = false;
    bVar2 = false;
    goto LAB_00636e1c;
  default:
    bVar2 = true;
    if ((insn >> 0x1c & 1) != 0) goto switchD_00636cd3_caseD_f;
    goto LAB_00636dca;
  case 3:
  case 7:
  case 0xb:
    bVar2 = true;
    goto LAB_00636dca;
  case 8:
  case 0x10:
  case 0x14:
    if ((insn >> 0x1c & 1) != 0) goto switchD_00636cd3_caseD_f;
    break;
  case 0xc:
  case 0xd:
    break;
  case 0xe:
  case 0x1e:
    if ((uVar16 != 2 || (insn & 0x10000000) != 0) || ((s->isar->id_aa64isar0 & 0xf00000000000) == 0)
       ) goto switchD_00636cd3_caseD_f;
    bVar3 = true;
    bVar2 = false;
    _Var25 = false;
    goto LAB_00636e6c;
  case 0xf:
  case 0x1b:
    goto switchD_00636cd3_caseD_f;
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
    if (((insn >> 0x1c & 1) != 0) || (pAVar19 = s->isar, (pAVar19->id_aa64isar1 & 0xf0000) == 0))
    goto switchD_00636cd3_caseD_f;
    if (uVar16 != 2) {
      if ((uVar16 != 1) || (element != 0 && (bVar1 >> 6 & 1) == 0)) goto switchD_00636cd3_caseD_f;
      uVar16 = 2;
      goto LAB_00636df8;
    }
    bVar2 = false;
    bVar3 = false;
    _Var25 = false;
    goto LAB_00636eb7;
  case 0x1d:
  case 0x1f:
    if ((s->isar->id_aa64isar0 & 0xf0000000) == 0) goto switchD_00636cd3_caseD_f;
  }
  bVar2 = false;
LAB_00636dca:
  if ((uVar16 == 3) || (uVar16 == 0)) {
switchD_00636cd3_caseD_f:
    unallocated_encoding_aarch64(s);
    return;
  }
  bVar3 = true;
  _Var25 = false;
LAB_00636e1c:
  if (uVar16 == 3) {
LAB_00636eb7:
    if ((bVar1 >> 6 & uVar14 == 0) == 0) goto switchD_00636cd3_caseD_f;
    srcidx = srcidx | uVar8 << 4;
    local_b0 = MO_64;
    bVar4 = true;
    local_a0 = gen_helper_gvec_fcmlas_idx;
    bVar6 = false;
LAB_00636ef6:
    bVar5 = false;
  }
  else {
    if (uVar16 != 2) {
      if (uVar16 != 1) {
        iVar18 = 0x343f;
LAB_00637d97:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,iVar18,(char *)0x0);
      }
LAB_00636e33:
      element = uVar14 * 2 + element * 4 | uVar8;
      local_b0 = MO_16;
      bVar6 = true;
      local_a0 = gen_helper_gvec_fcmlah_idx;
      bVar4 = false;
      goto LAB_00636ef6;
    }
LAB_00636e6c:
    element = uVar14 + element * 2;
    srcidx = srcidx | uVar8 << 4;
    local_b0 = MO_32;
    bVar5 = true;
    local_a0 = gen_helper_gvec_fcmlah_idx;
    bVar4 = false;
    bVar6 = false;
  }
  _Var7 = fp_access_check(s);
  if (!_Var7) {
    return;
  }
  if (bVar3) {
    ptr = (TCGv_ptr)0x0;
  }
  else {
    ptr = get_fpstatus_ptr_aarch64(tcg_ctx,_Var25);
  }
  uVar8 = insn >> 5 & 0x1f;
  uVar16 = insn & 0x1f;
  if (uVar23 < 0x1f) {
    if ((0xaa0000U >> (uVar22 | uVar20) & 1) != 0) {
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,uVar16 * 0x100 + 0xc10,uVar8 * 0x100 + 0xc10,srcidx * 0x100 + 0xc10,ptr,
                 (insn >> 0x1b & 8) + 8,s->sve_len,(insn >> 0xd & 3) + element * 4,local_a0);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
      return;
    }
    if ((0x11000011U >> (uVar22 | uVar20) & 1) != 0) {
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,uVar16 * 0x100 + 0xc10,uVar8 * 0x100 + 0xc10,srcidx * 0x100 + 0xc10,
                 tcg_ctx->cpu_env,(insn >> 0x1b & 8) + 8,s->sve_len,
                 (uVar17 >> 0x1c) + element * 4 | insn >> 0xe & 1,gen_helper_gvec_fmlal_idx_a64);
      return;
    }
    if ((0x40004000U >> (uVar22 | uVar20) & 1) != 0) {
      fn = gen_helper_gvec_udot_idx_b;
      if (uVar17 == 0) {
        fn = gen_helper_gvec_sdot_idx_b;
      }
      gen_gvec_op3_ool(s,(_Bool)(bVar1 >> 6 & 1),uVar16,uVar8,srcidx,element,fn);
      return;
    }
  }
  if (bVar4) {
    pTVar9 = tcg_temp_new_i64(tcg_ctx);
    if ((bool)(bVar2 | bVar3 | (insn >> 0x1e & 1) == 0)) {
      __assert_fail("is_fp && is_q && !is_long",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x347a,"void disas_simd_indexed(DisasContext *, uint32_t)");
    }
    read_vec_element(s,pTVar9,srcidx,element,MO_64);
    for (iVar18 = 0; 2 - (uint)((insn >> 0x1c & 1) != 0) != iVar18; iVar18 = iVar18 + 1) {
      pTVar10 = tcg_temp_new_i64(tcg_ctx);
      pTVar11 = tcg_temp_new_i64(tcg_ctx);
      read_vec_element(s,pTVar10,uVar8,iVar18,MO_64);
      switch((uVar23 - 1) * 0x40000000 | uVar23 - 1 >> 2) {
      case 1:
        gen_helper_vfp_negd(tcg_ctx,pTVar10,pTVar10);
      case 0:
        read_vec_element(s,pTVar11,uVar16,iVar18,MO_64);
        gen_helper_vfp_muladdd(tcg_ctx,pTVar11,pTVar10,pTVar9,pTVar11,ptr);
        break;
      case 2:
        gen_helper_vfp_muld(tcg_ctx,pTVar11,pTVar10,pTVar9,ptr);
        break;
      default:
        iVar18 = 0x3494;
        goto LAB_00637d97;
      case 6:
        gen_helper_vfp_mulxd(tcg_ctx,pTVar11,pTVar10,pTVar9,ptr);
      }
      write_vec_element(s,pTVar11,uVar16,iVar18,MO_64);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar11 + (long)tcg_ctx));
    }
    _Var25 = (insn >> 0x1c & 1) == 0;
    ts = (TCGTemp *)(pTVar9 + (long)tcg_ctx);
  }
  else {
    if (bVar2) {
      if (bVar5) {
        MVar24 = (uint)((insn & 0x20001000) != 0x20000000) * 4 + MO_32;
        pTVar9 = tcg_temp_new_i64(tcg_ctx);
        read_vec_element(s,pTVar9,srcidx,element,MVar24);
        for (lVar21 = 0; 2 - (ulong)(insn >> 0x1c & 1) != lVar21; lVar21 = lVar21 + 1) {
          pTVar10 = tcg_temp_new_i64(tcg_ctx);
          iVar18 = (insn >> 0x1d & 2) + (int)lVar21;
          if ((insn & 0x10000000) != 0) {
            iVar18 = 0;
          }
          read_vec_element(s,pTVar10,uVar8,iVar18,MVar24);
          tcg_dest = tcg_temp_new_i64(tcg_ctx);
          tcg_res[lVar21] = tcg_dest;
          pTVar11 = tcg_dest;
          if ((insn & 0xe000) != 0xa000) {
            pTVar11 = tcg_temp_new_i64(tcg_ctx);
          }
          tcg_gen_mul_i64_aarch64(tcg_ctx,pTVar11,pTVar10,pTVar9);
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
          if ((insn >> 0xc & 1) != 0) {
            gen_helper_neon_addl_saturate_s64(tcg_ctx,pTVar11,tcg_ctx->cpu_env,pTVar11,pTVar11);
          }
          if ((insn & 0xe000) != 0xa000) {
            read_vec_element(s,tcg_dest,uVar16,(int)lVar21,MO_64);
            if (uVar20 - 2 < 6) {
              (*(code *)(&DAT_00b85c7c + *(int *)(&DAT_00b85c7c + (ulong)(uVar20 - 2) * 4)))();
              return;
            }
            iVar18 = 0x3597;
            goto LAB_00637d97;
          }
        }
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar9 + (long)tcg_ctx));
        clear_vec_high(s,(insn >> 0x1c & 1) == 0,uVar16);
        if ((insn >> 0x1c & 1) != 0) {
LAB_00637d2f:
          tcg_res[1] = tcg_const_i64_aarch64(tcg_ctx,0);
        }
      }
      else {
        pTVar12 = tcg_temp_new_i32(tcg_ctx);
        read_vec_element_i32(s,pTVar12,srcidx,element,MO_16);
        if ((insn >> 0x1c & 1) == 0) {
          local_a0 = (code *)0x2;
          tcg_gen_deposit_i32_aarch64(tcg_ctx,pTVar12,pTVar12,pTVar12,0x10,0x10);
        }
        else {
          local_a0 = (code *)0x1;
        }
        for (lVar21 = 0; local_a0 != (code *)lVar21; lVar21 = lVar21 + 1) {
          pTVar13 = tcg_temp_new_i32(tcg_ctx);
          iVar18 = (int)lVar21;
          if ((insn >> 0x1c & 1) == 0) {
            iVar15 = (insn >> 0x1d & 2) + iVar18;
            MVar24 = MO_32;
          }
          else {
            MVar24 = MO_16;
            iVar15 = iVar18;
          }
          read_vec_element_i32(s,pTVar13,uVar8,iVar15,MVar24);
          pTVar10 = tcg_temp_new_i64(tcg_ctx);
          tcg_res[lVar21] = pTVar10;
          pTVar9 = pTVar10;
          if ((insn & 0xe000) != 0xa000) {
            pTVar9 = tcg_temp_new_i64(tcg_ctx);
          }
          if ((insn & 0x20001000) == 0x20000000) {
            gen_helper_neon_mull_u16(tcg_ctx,pTVar9,pTVar13,pTVar12);
          }
          else {
            gen_helper_neon_mull_s16(tcg_ctx,pTVar9,pTVar13,pTVar12);
          }
          if ((insn >> 0xc & 1) != 0) {
            gen_helper_neon_addl_saturate_s32(tcg_ctx,pTVar9,tcg_ctx->cpu_env,pTVar9,pTVar9);
          }
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar13 + (long)tcg_ctx));
          if ((insn & 0xe000) != 0xa000) {
            read_vec_element(s,pTVar10,uVar16,iVar18,MO_64);
            if (uVar20 - 2 < 6) {
              (*(code *)(&DAT_00b85c64 + *(int *)(&DAT_00b85c64 + (ulong)(uVar20 - 2) * 4)))();
              return;
            }
            iVar18 = 0x35e4;
            goto LAB_00637d97;
          }
        }
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar12 + (long)tcg_ctx));
        if ((insn >> 0x1c & 1) != 0) {
          tcg_gen_ext32u_i64_aarch64(tcg_ctx,tcg_res[0],tcg_res[0]);
          goto LAB_00637d2f;
        }
      }
      for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
        pTVar9 = tcg_res[lVar21];
        write_vec_element(s,pTVar9,uVar16,(int)lVar21,MO_64);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar9 + (long)tcg_ctx));
      }
      goto LAB_00637a78;
    }
    uVar17 = insn >> 0x1c & 1;
    pTVar12 = tcg_temp_new_i32(tcg_ctx);
    iVar18 = 1;
    if (uVar17 == 0) {
      iVar18 = (insn >> 0x1d & 2) + 2;
    }
    read_vec_element_i32(s,pTVar12,srcidx,element,local_b0);
    if (bVar6 && (char)uVar17 == '\0') {
      tcg_gen_deposit_i32_aarch64(tcg_ctx,pTVar12,pTVar12,pTVar12,0x10,0x10);
    }
    MVar24 = MO_32;
    if ((insn & 0x10000000) != 0) {
      MVar24 = local_b0;
    }
    ts = (TCGTemp *)(pTVar12 + (long)tcg_ctx);
    for (iVar15 = 0; iVar18 != iVar15; iVar15 = iVar15 + 1) {
      pTVar13 = tcg_temp_new_i32(tcg_ctx);
      retval = tcg_temp_new_i32(tcg_ctx);
      read_vec_element_i32(s,pTVar13,uVar8,iVar15,MVar24);
      if (uVar23 - 1 < 0x14) {
        (*(code *)(&DAT_00b85c14 + *(int *)(&DAT_00b85c14 + (ulong)(uVar23 - 1) * 4)))();
        return;
      }
      if (uVar23 == 0x19) {
        if (local_b0 == MO_32) {
          gen_helper_vfp_mulxs(tcg_ctx,retval,pTVar13,pTVar12,ptr);
          goto LAB_00637978;
        }
        if (local_b0 != MO_16) {
          iVar18 = 0x3516;
          goto LAB_00637d97;
        }
        if ((insn >> 0x1c & 1) != 0) {
          gen_helper_advsimd_mulxh(tcg_ctx,retval,pTVar13,pTVar12,ptr);
          goto LAB_00637989;
        }
        tcg_res[0] = (TCGv_i64)(pTVar13 + (long)&tcg_ctx->pool_cur);
        tcg_res[1] = (TCGv_i64)ts;
        tcg_gen_callN_aarch64
                  (tcg_ctx,helper_advsimd_mulx2h_aarch64,
                   (TCGTemp *)(retval + (long)&tcg_ctx->pool_cur),3,(TCGTemp **)tcg_res);
LAB_00637a15:
        write_vec_element_i32(s,retval,uVar16,iVar15,MO_32);
      }
      else {
        if (uVar23 == 0x1d) {
          read_vec_element_i32(s,retval,uVar16,iVar15,MVar24);
          if (bVar6) {
            gen_helper_neon_qrdmlah_s16(tcg_ctx,retval,tcg_ctx->cpu_env,pTVar13,pTVar12,retval);
          }
          else {
            gen_helper_neon_qrdmlah_s32(tcg_ctx,retval,tcg_ctx->cpu_env,pTVar13,pTVar12,retval);
          }
        }
        else {
          if (uVar23 != 0x1f) {
            iVar18 = 0x3542;
            goto LAB_00637d97;
          }
          read_vec_element_i32(s,retval,uVar16,iVar15,MVar24);
          if (bVar6) {
            gen_helper_neon_qrdmlsh_s16(tcg_ctx,retval,tcg_ctx->cpu_env,pTVar13,pTVar12,retval);
          }
          else {
            gen_helper_neon_qrdmlsh_s32(tcg_ctx,retval,tcg_ctx->cpu_env,pTVar13,pTVar12,retval);
          }
        }
LAB_00637978:
        if ((insn >> 0x1c & 1) == 0) goto LAB_00637a15;
LAB_00637989:
        write_fp_sreg(s,uVar16,retval);
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar13 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
    }
    _Var25 = (_Bool)(bVar1 >> 6 & 1);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  clear_vec_high(s,_Var25,uVar16);
LAB_00637a78:
  if (ptr != (TCGv_ptr)0x0) {
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
  }
  return;
}

Assistant:

static void disas_simd_indexed(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* This encoding has two kinds of instruction:
     *  normal, where we perform elt x idxelt => elt for each
     *     element in the vector
     *  long, where we perform elt x idxelt and generate a result of
     *     double the width of the input element
     * The long ops have a 'part' specifier (ie come in INSN, INSN2 pairs).
     */
    bool is_scalar = extract32(insn, 28, 1);
    bool is_q = extract32(insn, 30, 1);
    bool u = extract32(insn, 29, 1);
    int size = extract32(insn, 22, 2);
    int l = extract32(insn, 21, 1);
    int m = extract32(insn, 20, 1);
    /* Note that the Rm field here is only 4 bits, not 5 as it usually is */
    int rm = extract32(insn, 16, 4);
    int opcode = extract32(insn, 12, 4);
    int h = extract32(insn, 11, 1);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool is_long = false;
    int is_fp = 0;
    bool is_fp16 = false;
    int index;
    TCGv_ptr fpst;

    switch (16 * u + opcode) {
    case 0x08: /* MUL */
    case 0x10: /* MLA */
    case 0x14: /* MLS */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x02: /* SMLAL, SMLAL2 */
    case 0x12: /* UMLAL, UMLAL2 */
    case 0x06: /* SMLSL, SMLSL2 */
    case 0x16: /* UMLSL, UMLSL2 */
    case 0x0a: /* SMULL, SMULL2 */
    case 0x1a: /* UMULL, UMULL2 */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        is_long = true;
        break;
    case 0x03: /* SQDMLAL, SQDMLAL2 */
    case 0x07: /* SQDMLSL, SQDMLSL2 */
    case 0x0b: /* SQDMULL, SQDMULL2 */
        is_long = true;
        break;
    case 0x0c: /* SQDMULH */
    case 0x0d: /* SQRDMULH */
        break;
    case 0x01: /* FMLA */
    case 0x05: /* FMLS */
    case 0x09: /* FMUL */
    case 0x19: /* FMULX */
        is_fp = 1;
        break;
    case 0x1d: /* SQRDMLAH */
    case 0x1f: /* SQRDMLSH */
        if (!dc_isar_feature(aa64_rdm, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_dp, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        if (is_scalar || !dc_isar_feature(aa64_fcma, s)) {
            unallocated_encoding(s);
            return;
        }
        is_fp = 2;
        break;
    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_fhm, s)) {
            unallocated_encoding(s);
            return;
        }
        size = MO_16;
        /* is_fp, but we pass tcg_ctx->cpu_env not fp_status.  */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    switch (is_fp) {
    case 1: /* normal fp */
        /* convert insn encoded size to MemOp size */
        switch (size) {
        case 0: /* half-precision */
            size = MO_16;
            is_fp16 = true;
            break;
        case MO_32: /* single precision */
        case MO_64: /* double precision */
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    case 2: /* complex fp */
        /* Each indexable element is a complex pair.  */
        size += 1;
        switch (size) {
        case MO_32:
            if (h && !is_q) {
                unallocated_encoding(s);
                return;
            }
            is_fp16 = true;
            break;
        case MO_64:
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    default: /* integer */
        switch (size) {
        case MO_8:
        case MO_64:
            unallocated_encoding(s);
            return;
        }
        break;
    }
    if (is_fp16 && !dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    /* Given MemOp size, adjust register and indexing.  */
    switch (size) {
    case MO_16:
        index = h << 2 | l << 1 | m;
        break;
    case MO_32:
        index = h << 1 | l;
        rm |= m << 4;
        break;
    case MO_64:
        if (l || !is_q) {
            unallocated_encoding(s);
            return;
        }
        index = h;
        rm |= m << 4;
        break;
    default:
        g_assert_not_reached();
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fp) {
        fpst = get_fpstatus_ptr(tcg_ctx, is_fp16);
    } else {
        fpst = NULL;
    }

    switch (16 * u + opcode) {
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, index,
                         u ? gen_helper_gvec_udot_idx_b
                         : gen_helper_gvec_sdot_idx_b);
        return;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        {
            int rot = extract32(insn, 13, 2);
            int data = (index << 2) | rot;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), fpst,
                               is_q ? 16 : 8, vec_full_reg_size(s), data,
                               size == MO_64
                               ? gen_helper_gvec_fcmlas_idx
                               : gen_helper_gvec_fcmlah_idx);
            tcg_temp_free_ptr(tcg_ctx, fpst);
        }
        return;

    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        {
            int is_s = extract32(opcode, 2, 1);
            int is_2 = u;
            int data = (index << 2) | (is_2 << 1) | is_s;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                               is_q ? 16 : 8, vec_full_reg_size(s),
                               data, gen_helper_gvec_fmlal_idx_a64);
        }
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);
        int pass;

        assert(is_fp && is_q && !is_long);

        read_vec_element(s, tcg_idx, rm, index, MO_64);

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);

            switch (16 * u + opcode) {
            case 0x05: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                gen_helper_vfp_negd(tcg_ctx, tcg_op, tcg_op);
                /* fall through */
            case 0x01: /* FMLA */
                read_vec_element(s, tcg_res, rd, pass, MO_64);
                gen_helper_vfp_muladdd(tcg_ctx, tcg_res, tcg_op, tcg_idx, tcg_res, fpst);
                break;
            case 0x09: /* FMUL */
                gen_helper_vfp_muld(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            case 0x19: /* FMULX */
                gen_helper_vfp_mulxd(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            write_vec_element(s, tcg_res, rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_op);
            tcg_temp_free_i64(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_idx);
        clear_vec_high(s, !is_scalar, rd);
    } else if (!is_long) {
        /* 32 bit floating point, or 16 or 32 bit integer.
         * For the 16 bit scalar case we use the usual Neon helpers and
         * rely on the fact that 0 op 0 == 0 with no side effects.
         */
        TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        read_vec_element_i32(s, tcg_idx, rm, index, size);

        if (size == 1 && !is_scalar) {
            /* The simplest way to handle the 16x16 indexed ops is to duplicate
             * the index into both halves of the 32 bit tcg_idx and then use
             * the usual Neon helpers.
             */
            tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
        }

        for (pass = 0; pass < maxpasses; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, is_scalar ? size : MO_32);

            switch (16 * u + opcode) {
            case 0x08: /* MUL */
            case 0x10: /* MLA */
            case 0x14: /* MLS */
            {
                static NeonGenTwoOpFn * const fns[2][2] = {
                    { gen_helper_neon_add_u16, gen_helper_neon_sub_u16 },
                    { tcg_gen_add_i32, tcg_gen_sub_i32 },
                };
                NeonGenTwoOpFn *genfn;
                bool is_sub = opcode == 0x4;

                if (size == 1) {
                    gen_helper_neon_mul_u16(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                } else {
                    tcg_gen_mul_i32(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                }
                if (opcode == 0x8) {
                    break;
                }
                read_vec_element_i32(s, tcg_op, rd, pass, MO_32);
                genfn = fns[size - 1][is_sub];
                genfn(tcg_ctx, tcg_res, tcg_op, tcg_res);
                break;
            }
            case 0x05: /* FMLS */
            case 0x01: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                switch (size) {
                case 1:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for fused
                         * multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80008000);
                    }
                    if (is_scalar) {
                        gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                   tcg_res, fpst);
                    } else {
                        gen_helper_advsimd_muladd2h(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                    tcg_res, fpst);
                    }
                    break;
                case 2:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for
                         * fused multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80000000);
                    }
                    gen_helper_vfp_muladds(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                           tcg_res, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x09: /* FMUL */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op,
                                                tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mul2h(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_muls(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x19: /* FMULX */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mulx2h(tcg_ctx, tcg_res, tcg_op,
                                                  tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_mulxs(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x0c: /* SQDMULH */
                if (size == 1) {
                    gen_helper_neon_qdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                }
                break;
            case 0x0d: /* SQRDMULH */
                if (size == 1) {
                    gen_helper_neon_qrdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qrdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                }
                break;
            case 0x1d: /* SQRDMLAH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlah_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlah_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            case 0x1f: /* SQRDMLSH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlsh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlsh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_idx);
        clear_vec_high(s, is_q, rd);
    } else {
        /* long ops: 16x16->32 or 32x32->64 */
        TCGv_i64 tcg_res[2];
        int pass;
        bool satop = extract32(opcode, 0, 1);
        MemOp memop = MO_32;

        if (satop || !u) {
            memop |= MO_SIGN;
        }

        if (size == 2) {
            TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_idx, rm, index, memop);

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
                TCGv_i64 tcg_passres;
                int passelt;

                if (is_scalar) {
                    passelt = 0;
                } else {
                    passelt = pass + (is_q * 2);
                }

                read_vec_element(s, tcg_op, rn, passelt, memop);

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                tcg_gen_mul_i64(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                tcg_temp_free_i64(tcg_ctx, tcg_op);

                if (satop) {
                    /* saturating, doubling */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    tcg_gen_sub_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    tcg_gen_neg_i64(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_idx);

            clear_vec_high(s, !is_scalar, rd);
        } else {
            TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);

            assert(size == 1);
            read_vec_element_i32(s, tcg_idx, rm, index, size);

            if (!is_scalar) {
                /* The simplest way to handle the 16x16 indexed ops is to
                 * duplicate the index into both halves of the 32 bit tcg_idx
                 * and then use the usual Neon helpers.
                 */
                tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
            }

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
                TCGv_i64 tcg_passres;

                if (is_scalar) {
                    read_vec_element_i32(s, tcg_op, rn, pass, size);
                } else {
                    read_vec_element_i32(s, tcg_op, rn,
                                         pass + (is_q * 2), MO_32);
                }

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                if (memop & MO_SIGN) {
                    gen_helper_neon_mull_s16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_mull_u16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                }
                if (satop) {
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }
                tcg_temp_free_i32(tcg_ctx, tcg_op);

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    gen_helper_neon_addl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    gen_helper_neon_subl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    gen_helper_neon_negl_u32(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_idx);

            if (is_scalar) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_res[0], tcg_res[0]);
            }
        }

        if (is_scalar) {
            tcg_res[1] = tcg_const_i64(tcg_ctx, 0);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}